

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cc
# Opt level: O1

int __thiscall lock::check(lock *this,char *bytes,int length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  
  bVar10 = *bytes;
  this->aRealKey[0] = bVar10;
  bVar1 = bytes[1];
  this->aRealKey[1] = bVar1;
  bVar2 = bytes[2];
  this->aRealKey[2] = bVar2;
  bVar3 = bytes[3];
  this->aRealKey[3] = bVar3;
  iVar4 = this->modulo;
  uVar9 = (long)(int)((uint)bVar2 << 8 | (uint)bVar1 << 0x10 | (uint)bVar10 << 0x18 | (uint)bVar3) %
          (long)iVar4;
  uVar8 = uVar9 & 0xffffffff;
  uVar7 = (uint)uVar9 & 0x1f;
  uVar9 = 7;
  if (7 < uVar7) {
    uVar9 = (ulong)uVar7;
  }
  iVar5 = this->slope;
  iVar6 = this->offset;
  bVar10 = 1;
  lVar11 = 0;
  do {
    uVar8 = (long)((int)uVar8 * iVar5 + iVar6) % (long)iVar4 & 0xffffffff;
    this->aRealKey[lVar11 + 4] = (char)uVar8;
    bVar10 = bVar10 & (char)uVar8 == bytes[lVar11 + 4];
    lVar11 = lVar11 + 1;
  } while (uVar9 - 4 != lVar11);
  this->aRealKeyLength = (int)uVar9;
  return (int)(bVar10 & (int)uVar9 == length);
}

Assistant:

int lock::check(char * bytes, int length) {
  aRealKey[0] = bytes[0];
  aRealKey[1] = bytes[1];
  aRealKey[2] = bytes[2];
  aRealKey[3] = bytes[3];
  int seed = ((aRealKey[0] << 24) + ((aRealKey[1] << 16) & 0xff0000) +
          ((aRealKey[2] << 8) & 0xff00) + (aRealKey[3] & 0xff));
  seed = seed % modulo;
  int size = seed & KEY_MASK;
  if (size < 7) {
    size = 7;
  }
  int index = 4;
  bool goodKey = true;
  while (index < size) {
    seed = (seed * slope + offset) % modulo;
    aRealKey[index] = seed & 0xff;
    goodKey &= aRealKey[index] == bytes[index];
    index++;
  }
  if (goodKey) {
    goodKey = size == length;  // if we don't match the input size it
                               // can't be a good key
  }
  aRealKeyLength = size;
  return (goodKey ? 1 : 0);
}